

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_global_segment_info(global_segment sec)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  void **ppvVar4;
  ulong uVar5;
  double dVar6;
  
  ppvVar4 = &((sec.global_segment_addr)->init_data).arg;
  uVar5 = 0;
  do {
    if (sec.global_segment_count == uVar5) {
      return;
    }
    pcVar2 = val_type(*(byte *)(ppvVar4 + -2));
    bVar1 = *(byte *)((long)ppvVar4 + -0xf);
    pcVar3 = val_type(*(byte *)(ppvVar4 + -2));
    printf("  - global[%d]: %s mutable=%d - init %s=",uVar5 & 0xffffffff,pcVar2,(ulong)bVar1,pcVar3)
    ;
    switch(*(undefined1 *)(ppvVar4 + -2)) {
    case 0x7c:
      dVar6 = **ppvVar4;
      goto LAB_00102cdc;
    case 0x7d:
      dVar6 = (double)**ppvVar4;
LAB_00102cdc:
      printf("%f\n",dVar6);
      break;
    case 0x7e:
      printf("%ld\n",**ppvVar4);
      break;
    case 0x7f:
      printf("%d\n",(ulong)**ppvVar4);
      break;
    default:
      fwrite("\nwrong typeID\n",0xe,1,_stderr);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/cmd/wcasm-objdump/print.c"
                    ,0xd7,"void print_global_segment_info(global_segment)");
    }
    uVar5 = uVar5 + 1;
    ppvVar4 = ppvVar4 + 3;
  } while( true );
}

Assistant:

void print_global_segment_info(global_segment sec) {
    global_pointer global_segment_addr;
    for (int i = 0; i < sec.global_segment_count; ++i) {
        global_segment_addr = sec.global_segment_addr + i;
        printf("  - global[%d]: %s mutable=%d - init %s=", i, val_type(global_segment_addr->type.val_type),
               global_segment_addr->type.mut_type, val_type(global_segment_addr->type.val_type));
        switch (global_segment_addr->type.val_type) {
            case I32:
                printf("%d\n", *(int32 *) global_segment_addr->init_data.arg);
                break;
            case I64:
                printf("%ld\n", *(int64 *) global_segment_addr->init_data.arg);
                break;
            case F32:
                printf("%f\n", *(float32 *) global_segment_addr->init_data.arg);
                break;
            case F64:
                printf("%f\n", *(float64 *) global_segment_addr->init_data.arg);
                break;
            default:
                errorExit("\nwrong typeID\n");
        }
    }
}